

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassesAndEnums
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  int iVar1;
  int iVar2;
  Printer *in_RCX;
  GeneratorOptions *in_RDX;
  Generator *in_RSI;
  int i_2;
  int i_1;
  int i;
  EnumDescriptor *in_stack_00000158;
  Printer *in_stack_00000160;
  GeneratorOptions *in_stack_00000168;
  Generator *in_stack_00000170;
  Descriptor *in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 local_2c;
  int iVar3;
  int index;
  Generator *pGVar4;
  
  iVar3 = 0;
  while( true ) {
    index = iVar3;
    iVar1 = FileDescriptor::message_type_count((FileDescriptor *)in_RCX);
    if (iVar1 <= iVar3) break;
    pGVar4 = in_RSI;
    FileDescriptor::message_type((FileDescriptor *)in_RCX,index);
    GenerateClassConstructorAndDeclareExtensionFieldInfo
              (in_RSI,(GeneratorOptions *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    iVar3 = index + 1;
    in_RSI = pGVar4;
  }
  iVar3 = 0;
  while( true ) {
    iVar1 = iVar3;
    iVar2 = FileDescriptor::message_type_count((FileDescriptor *)in_RCX);
    if (iVar2 <= iVar3) break;
    FileDescriptor::message_type((FileDescriptor *)in_RCX,iVar1);
    GenerateClass(in_RSI,in_RDX,in_RCX,(Descriptor *)CONCAT44(index,iVar1));
    iVar3 = iVar1 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar3 = FileDescriptor::enum_type_count((FileDescriptor *)in_RCX);
    if (iVar3 <= local_2c) break;
    FileDescriptor::enum_type((FileDescriptor *)in_RCX,local_2c);
    GenerateEnum(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Generator::GenerateClassesAndEnums(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const FileDescriptor* file) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClassConstructorAndDeclareExtensionFieldInfo(options, printer,
                                                         file->message_type(i));
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClass(options, printer, file->message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(options, printer, file->enum_type(i));
  }
}